

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_names(string *current)

{
  value_type *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string local_90 [24];
  string *in_stack_ffffffffffffff88;
  string local_60 [32];
  string local_40 [32];
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14a9e5);
  local_20 = 0;
  while (local_20 = ::std::__cxx11::string::find((char)in_RSI,0x2c), local_20 != -1) {
    ::std::__cxx11::string::substr((ulong)local_60,(ulong)in_RSI);
    trim_copy(in_stack_ffffffffffffff88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this,in_RSI);
    ::std::__cxx11::string::~string(local_40);
    ::std::__cxx11::string::~string(local_60);
    ::std::__cxx11::string::substr((ulong)local_90,(ulong)in_RSI);
    ::std::__cxx11::string::operator=((string *)in_RSI,local_90);
    ::std::__cxx11::string::~string(local_90);
  }
  trim_copy(in_stack_ffffffffffffff88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this,in_RSI);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::vector<std::string> split_names(std::string current) {
    std::vector<std::string> output;
    std::size_t val = 0;
    while((val = current.find(',')) != std::string::npos) {
        output.push_back(trim_copy(current.substr(0, val)));
        current = current.substr(val + 1);
    }
    output.push_back(trim_copy(current));
    return output;
}